

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP4Serializer.cpp
# Opt level: O2

void __thiscall
adios2::format::BP4Serializer::AggregateCollectiveMetadata
          (BP4Serializer *this,Comm *comm,BufferSTL *bufferSTL,bool inMetadataBuffer)

{
  _func_int *p_Var1;
  size_t size;
  int iVar2;
  size_t sVar3;
  undefined3 in_register_00000009;
  allocator local_d5;
  undefined4 local_d4;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_d4 = CONCAT31(in_register_00000009,inMetadataBuffer);
  p_Var1 = (this->super_BP4Base)._vptr_BP4Base[-3];
  std::__cxx11::string::string((string *)&local_50,"buffering",&local_d5);
  profiling::IOChrono::Start
            ((IOChrono *)(&(this->super_BP4Base).field_0x278 + (long)p_Var1),&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  p_Var1 = (this->super_BP4Base)._vptr_BP4Base[-3];
  std::__cxx11::string::string((string *)&local_70,"meta_sort_merge",&local_d5);
  profiling::IOChrono::Start
            ((IOChrono *)(&(this->super_BP4Base).field_0x278 + (long)p_Var1),&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  AggregateCollectiveMetadataIndices(this,comm,bufferSTL);
  iVar2 = helper::Comm::Rank(comm);
  size = (bufferSTL->super_Buffer).m_Position;
  if (iVar2 == 0) {
    if ((char)local_d4 == '\0') {
      sVar3 = (bufferSTL->super_Buffer).m_AbsolutePosition;
    }
    else {
      sVar3 = 0;
    }
    (bufferSTL->super_Buffer).m_AbsolutePosition = sVar3 + size;
  }
  std::__cxx11::string::string((string *)&local_90,"after collective metadata is done",&local_d5);
  BufferSTL::Resize(bufferSTL,size,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  p_Var1 = (this->super_BP4Base)._vptr_BP4Base[-3];
  std::__cxx11::string::string((string *)&local_b0,"meta_sort_merge",&local_d5);
  profiling::IOChrono::Stop
            ((IOChrono *)(&(this->super_BP4Base).field_0x278 + (long)p_Var1),&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  p_Var1 = (this->super_BP4Base)._vptr_BP4Base[-3];
  std::__cxx11::string::string((string *)&local_d0,"buffering",&local_d5);
  profiling::IOChrono::Stop
            ((IOChrono *)(&(this->super_BP4Base).field_0x278 + (long)p_Var1),&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  return;
}

Assistant:

void BP4Serializer::AggregateCollectiveMetadata(helper::Comm const &comm, BufferSTL &bufferSTL,
                                                const bool inMetadataBuffer)
{
    m_Profiler.Start("buffering");
    m_Profiler.Start("meta_sort_merge");

    AggregateCollectiveMetadataIndices(comm, bufferSTL);

    int rank = comm.Rank();
    if (rank == 0)
    {
        if (inMetadataBuffer)
        {
            bufferSTL.m_AbsolutePosition = bufferSTL.m_Position;
        }
        else
        {
            bufferSTL.m_AbsolutePosition += bufferSTL.m_Position;
        }
    }

    bufferSTL.Resize(bufferSTL.m_Position, "after collective metadata is done");

    m_Profiler.Stop("meta_sort_merge");
    m_Profiler.Stop("buffering");
}